

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint32_t __thiscall
google::protobuf::io::CodedInputStream::ReadTagFallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  long lVar1;
  uint8_t *puVar2;
  int iVar3;
  Nonnull<const_char_*> failure_msg;
  Nullable<const_char_*> failure_msg_00;
  uint32_t uVar4;
  int iVar5;
  long lVar7;
  uint8_t *puVar8;
  int local_2c;
  LogMessage local_28;
  int iVar6;
  
  iVar3 = (int)this->buffer_;
  iVar6 = (int)this->buffer_end_;
  iVar5 = iVar6 - iVar3;
  if (9 < iVar5) {
LAB_002868c7:
    local_28.errno_saver_.saved_errno_ = first_byte_or_zero;
    local_2c._0_1_ = *this->buffer_;
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_char>
                            ((uint *)&local_28,(uchar *)&local_2c,"first_byte_or_zero == buffer_[0]"
                            );
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      puVar2 = this->buffer_;
      if (first_byte_or_zero == 0) {
        this->buffer_ = puVar2 + 1;
        return 0;
      }
      local_2c._0_1_ = *puVar2;
      local_28.errno_saver_.saved_errno_ = first_byte_or_zero;
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_char,unsigned_int>
                              ((uchar *)&local_2c,(uint *)&local_28,"*buffer == first_byte");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        local_28.errno_saver_.saved_errno_ = first_byte_or_zero & 0x80;
        local_2c = 0x80;
        failure_msg_00 =
             absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,int>
                       ((uint *)&local_28,&local_2c,"first_byte & 0x80 == 0x80");
        if (failure_msg_00 != (Nullable<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_28,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                     ,0x1af,failure_msg_00);
          absl::lts_20250127::log_internal::LogMessage::operator<<(&local_28,first_byte_or_zero);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_28);
        }
        uVar4 = ((uint)puVar2[1] * 0x80 + first_byte_or_zero) - 0x80;
        if ((char)puVar2[1] < '\0') {
          uVar4 = (uVar4 + (uint)puVar2[2] * 0x4000) - 0x4000;
          if ((char)puVar2[2] < '\0') {
            uVar4 = (uVar4 + (uint)puVar2[3] * 0x200000) - 0x200000;
            if ((char)puVar2[3] < '\0') {
              puVar8 = puVar2 + 5;
              uVar4 = uVar4 + (uint)puVar2[4] * 0x10000000 + 0xf0000000;
              if ((char)puVar2[4] < '\0') {
                lVar7 = 0;
                do {
                  if ((int)lVar7 == 5) {
                    return 0;
                  }
                  lVar1 = lVar7 + 1;
                  puVar2 = puVar8 + lVar7;
                  lVar7 = lVar1;
                } while ((char)*puVar2 < '\0');
                puVar8 = puVar8 + lVar1;
              }
            }
            else {
              puVar8 = puVar2 + 4;
            }
          }
          else {
            puVar8 = puVar2 + 3;
          }
        }
        else {
          puVar8 = puVar2 + 2;
        }
        this->buffer_ = puVar8;
        return uVar4;
      }
      iVar3 = 0x1ae;
    }
    else {
      iVar3 = 0x252;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,iVar3,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_28);
  }
  if (iVar5 < 1) {
    if (iVar6 == iVar3) {
      if (((0 < this->buffer_size_after_limit_) || (this->total_bytes_read_ == this->current_limit_)
          ) && (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_)
         ) {
        this->legitimate_message_end_ = true;
        return 0;
      }
    }
  }
  else if (-1 < (char)this->buffer_end_[-1]) goto LAB_002868c7;
  uVar4 = ReadTagSlow(this);
  return uVar4;
}

Assistant:

uint32_t CodedInputStream::ReadTagFallback(uint32_t first_byte_or_zero) {
  const int buf_size = BufferSize();
  if (buf_size >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buf_size > 0 && !(buffer_end_[-1] & 0x80))) {
    ABSL_DCHECK_EQ(first_byte_or_zero, buffer_[0]);
    if (first_byte_or_zero == 0) {
      ++buffer_;
      return 0;
    }
    uint32_t tag;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &tag);
    if (!p.first) {
      return 0;
    }
    buffer_ = p.second;
    return tag;
  } else {
    // We are commonly at a limit when attempting to read tags. Try to quickly
    // detect this case without making another function call.
    if ((buf_size == 0) &&
        ((buffer_size_after_limit_ > 0) ||
         (total_bytes_read_ == current_limit_)) &&
        // Make sure that the limit we hit is not total_bytes_limit_, since
        // in that case we still need to call Refresh() so that it prints an
        // error.
        total_bytes_read_ - buffer_size_after_limit_ < total_bytes_limit_) {
      // We hit a byte limit.
      legitimate_message_end_ = true;
      return 0;
    }
    return ReadTagSlow();
  }
}